

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O2

void __thiscall
OSTEI_HRR_Algorithm_Base::Create
          (OSTEI_HRR_Algorithm_Base *this,set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *am)

{
  long lVar1;
  QAM highest_am;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_90;
  undefined1 local_60 [48];
  
  lVar1 = std::_Rb_tree_decrement(&(am->_M_t)._M_impl.super__Rb_tree_header._M_header);
  QAM::QAM((QAM *)local_60,(QAM *)(lVar1 + 0x20));
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::_Rb_tree
            (&local_90,&am->_M_t);
  Create(this,(set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)&local_90,
         (uint)((int)local_60._4_4_ <= (int)local_60._0_4_),
         (int)local_60._8_4_ < (int)local_60._12_4_ ^ L);
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_90);
  std::__cxx11::string::~string((string *)(local_60 + 0x10));
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(std::set<QAM> am)
{
    QAM highest_am = *(am.rbegin());
	
    // What direction are we going for the bra?
	RRStepType brasteptype = RRStepType::J;  // Moving I->J
	if(highest_am[0] < highest_am[1])
	    brasteptype = RRStepType::I; // Moving J->I

	// What direction are we going for the ket?
	RRStepType ketsteptype = RRStepType::L;  // Moving K->L
	if(highest_am[2] < highest_am[3])
	    ketsteptype = RRStepType::K; // Moving L->K

    Create(am, brasteptype, ketsteptype);
}